

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O0

void __thiscall
MCTS::Node<ConnectFourState>::Node(Node<ConnectFourState> *this,ConnectFourState *state)

{
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  ConnectFourState *in_stack_00000018;
  
  *in_RDI = 0xffffffff;
  *(undefined8 *)(in_RDI + 2) = 0;
  in_RDI[4] = *in_RSI;
  *(undefined8 *)(in_RDI + 6) = 0;
  in_RDI[8] = 0;
  ConnectFourState::get_moves(in_stack_00000018);
  std::vector<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>::
  vector((vector<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_> *)
         0x135849);
  *(undefined8 *)(in_RDI + 0x16) = 0;
  return;
}

Assistant:

Node<State>::Node(const State& state) :
	move(State::no_move),
	parent(nullptr),
	player_to_move(state.player_to_move),
	wins(0),
	visits(0),
	moves(state.get_moves()),
	UCT_score(0)
{ }